

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_subject_alt_name(uchar **p,uchar *end,mbedtls_x509_sequence *subject_alt_name)

{
  byte bVar1;
  int iVar2;
  mbedtls_asn1_sequence *pmVar3;
  mbedtls_x509_sequence *local_58;
  mbedtls_asn1_sequence *cur;
  uchar tag;
  mbedtls_asn1_buf *buf;
  size_t tag_len;
  size_t len;
  mbedtls_x509_sequence *pmStack_28;
  int ret;
  mbedtls_x509_sequence *subject_alt_name_local;
  uchar *end_local;
  uchar **p_local;
  
  pmStack_28 = subject_alt_name;
  subject_alt_name_local = (mbedtls_x509_sequence *)end;
  end_local = (uchar *)p;
  iVar2 = mbedtls_asn1_get_tag(p,end,&tag_len,0x30);
  if (iVar2 == 0) {
    if ((mbedtls_x509_sequence *)(*(long *)end_local + tag_len) == subject_alt_name_local) {
      len._4_4_ = 0;
      local_58 = subject_alt_name;
      while (*(mbedtls_x509_sequence **)end_local < subject_alt_name_local) {
        if ((long)subject_alt_name_local - *(long *)end_local < 1) {
          return -0x2560;
        }
        bVar1 = **(byte **)end_local;
        *(long *)end_local = *(long *)end_local + 1;
        len._4_4_ = mbedtls_asn1_get_len
                              ((uchar **)end_local,(uchar *)subject_alt_name_local,(size_t *)&buf);
        if (len._4_4_ != 0) {
          return len._4_4_ + -0x2500;
        }
        if ((bVar1 & 0x80) != 0x80) {
          return -0x2562;
        }
        if (bVar1 == 0x82) {
          if ((local_58->buf).p != (uchar *)0x0) {
            if (local_58->next != (mbedtls_asn1_sequence *)0x0) {
              return -0x2500;
            }
            pmVar3 = (mbedtls_asn1_sequence *)calloc(1,0x20);
            local_58->next = pmVar3;
            if (local_58->next == (mbedtls_asn1_sequence *)0x0) {
              return -0x256a;
            }
            local_58 = local_58->next;
          }
          (local_58->buf).tag = 0x82;
          (local_58->buf).p = *(uchar **)end_local;
          (local_58->buf).len = (size_t)buf;
          *(size_t *)end_local = (local_58->buf).len + *(long *)end_local;
        }
        else {
          *(long *)end_local = (long)&buf->tag + *(long *)end_local;
        }
      }
      local_58->next = (mbedtls_asn1_sequence *)0x0;
      if (*(mbedtls_x509_sequence **)end_local == subject_alt_name_local) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = -0x2566;
      }
    }
    else {
      p_local._4_4_ = -0x2566;
    }
  }
  else {
    p_local._4_4_ = iVar2 + -0x2500;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_subject_alt_name( unsigned char **p,
                                      const unsigned char *end,
                                      mbedtls_x509_sequence *subject_alt_name )
{
    int ret;
    size_t len, tag_len;
    mbedtls_asn1_buf *buf;
    unsigned char tag;
    mbedtls_asn1_sequence *cur = subject_alt_name;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        if( ( end - *p ) < 1 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_OUT_OF_DATA );

        tag = **p;
        (*p)++;
        if( ( ret = mbedtls_asn1_get_len( p, end, &tag_len ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        if( ( tag & MBEDTLS_ASN1_CONTEXT_SPECIFIC ) != MBEDTLS_ASN1_CONTEXT_SPECIFIC )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

        /* Skip everything but DNS name */
        if( tag != ( MBEDTLS_ASN1_CONTEXT_SPECIFIC | 2 ) )
        {
            *p += tag_len;
            continue;
        }

        /* Allocate and assign next pointer */
        if( cur->buf.p != NULL )
        {
            if( cur->next != NULL )
                return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS );

            cur->next = mbedtls_calloc( 1, sizeof( mbedtls_asn1_sequence ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                        MBEDTLS_ERR_ASN1_ALLOC_FAILED );

            cur = cur->next;
        }

        buf = &(cur->buf);
        buf->tag = tag;
        buf->p = *p;
        buf->len = tag_len;
        *p += buf->len;
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}